

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void __thiscall TicSpecial::TicSpecial(TicSpecial *this)

{
  BYTE *pBVar1;
  int local_14;
  int i;
  TicSpecial *this_local;
  
  this->lastmaketic = -1;
  this->specialsize = 0x100;
  for (local_14 = 0; local_14 < 0x24; local_14 = local_14 + 1) {
    this->streams[local_14] = (BYTE *)0x0;
  }
  for (local_14 = 0; local_14 < 0x24; local_14 = local_14 + 1) {
    pBVar1 = (BYTE *)M_Malloc_Dbg(0x100,
                                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_net.cpp"
                                  ,0xcd);
    this->streams[local_14] = pBVar1;
    this->used[local_14] = 0;
  }
  this->okay = true;
  return;
}

Assistant:

TicSpecial ()
	{
		int i;

		lastmaketic = -1;
		specialsize = 256;

		for (i = 0; i < BACKUPTICS; i++)
			streams[i] = NULL;

		for (i = 0; i < BACKUPTICS; i++)
		{
			streams[i] = (BYTE *)M_Malloc (256);
			used[i] = 0;
		}
		okay = true;
	}